

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTAircraft.cpp
# Opt level: O0

void __thiscall MovingParam::moveTo(MovingParam *this,double tval,double _startTS)

{
  bool bVar1;
  uint uVar2;
  double *pdVar3;
  int __x;
  MovingParam *in_RDI;
  double *__val;
  double __x_00;
  double dVar4;
  double in_XMM1_Qa;
  double in_stack_ffffffffffffffd8;
  double local_10 [2];
  
  __val = local_10;
  pdVar3 = std::clamp<double>(__val,&in_RDI->defMin,&in_RDI->defMax);
  __x = (int)__val;
  local_10[0] = *pdVar3;
  bVar1 = dequal(local_10[0],in_RDI->val);
  if (bVar1) {
    SetVal(in_RDI,in_stack_ffffffffffffffd8);
  }
  else {
    bVar1 = dequal(in_RDI->valTo,local_10[0]);
    if (!bVar1) {
      in_RDI->valFrom = in_RDI->val;
      in_RDI->valTo = local_10[0];
      in_RDI->valDist = in_RDI->valTo - in_RDI->valFrom;
      in_RDI->bIncrease = 0.0 < in_RDI->valDist;
      uVar2 = std::isnan(in_XMM1_Qa);
      dVar4 = currCycle.simTime;
      if ((uVar2 & 1) == 0) {
        dVar4 = in_XMM1_Qa;
      }
      in_RDI->timeFrom = dVar4;
      std::abs(__x);
      dVar4 = fma(__x_00,in_RDI->defDuration,in_RDI->timeFrom);
      in_RDI->timeTo = dVar4;
    }
  }
  return;
}

Assistant:

void MovingParam::moveTo ( double tval, double _startTS )
{
    // Normalize between limits
    tval = std::clamp<double>(tval, defMin, defMax);
    
    // current value equals target already
    if (dequal(tval, val))
        SetVal(tval);                     // just set the target value bit-euqal, no moving
    // we shall move to a (new) given target:
    // calc required duration by using defining parameters
    else if ( !dequal(valTo, tval) ) {
        // set origin and desired target value
        valFrom = val;
        valTo = tval;
        valDist = valTo - valFrom;
        bIncrease = valDist > 0;

        // full travel from defMin to defMax takes defDuration
        // So: How much time shall we use? = Which share of the full duration do we need?
        // And: When will we be done?
        // timeTo = std::abs(valDist/defDist) * defDuration + timeFrom;
        timeFrom = std::isnan(_startTS) ? currCycle.simTime : _startTS;
        timeTo = fma(std::abs(valDist/defDist), defDuration, timeFrom);
    }
}